

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

void __thiscall Hex::Hexdumper<unsigned_char>::dump(Hexdumper<unsigned_char> *this,ostream *os)

{
  uint uVar1;
  long lVar2;
  char filler;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  long lVar8;
  ostream *poVar9;
  uchar *first;
  uchar *puVar10;
  int unitsperline;
  uchar *puVar11;
  pair<const_unsigned_char_*,_const_unsigned_char_*> curline;
  int local_58;
  pair<const_unsigned_char_*,_const_unsigned_char_*> local_48;
  
  filler = std::ios::fill();
  iVar5 = *(int *)(os + *(long *)(*(long *)os + -0x18) + 0x10);
  uVar1 = *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  uVar4 = uVar1 & 0xb0;
  if ((uVar1 >> 10 & 1) != 0) {
    Hexdumper_base::getbaseofs(os);
  }
  uVar6 = Hexdumper_base::getstep(os);
  uVar7 = Hexdumper_base::getthreshold(os);
  unitsperline = 0x40;
  if ((uVar1 >> 0xb & 1) == 0) {
    unitsperline = 0x10;
  }
  if (uVar4 == 0x20) {
    unitsperline = 0x20;
  }
  if (iVar5 != -1) {
    unitsperline = iVar5;
  }
  local_48.first = this->_first;
  lVar8 = *(long *)os;
  lVar2 = *(long *)(lVar8 + -0x18);
  *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(undefined8 *)(os + *(long *)(lVar8 + -0x18) + 0x10) = 0;
  lVar8 = (long)unitsperline;
  first = local_48.first;
  local_48.second = local_48.first;
  do {
    puVar10 = this->_last;
    if (puVar10 <= first) {
      Hexdumper_base::clearflags(os);
      return;
    }
    puVar11 = first + lVar8;
    if (puVar10 <= puVar11) {
      puVar11 = this->_last;
    }
    if (unitsperline == 0) {
      puVar11 = puVar10;
    }
    curline.first = first;
    curline.second = puVar11;
    if ((uVar1 >> 0xc & 1) == 0) {
LAB_00105f5f:
      if ((uVar1 >> 10 & 1) != 0) {
        *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 8;
        poVar9 = std::operator<<(os,0x30);
        *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
             *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::operator<<(poVar9,": ");
      }
      if ((uVar1 >> 0xb & 1) == 0) {
        output_hex(os,curline.first,curline.second,filler,uVar1 & 0x4a,
                   (bool)((byte)(uVar1 >> 9) & 1),(bool)((byte)(uVar1 >> 0xe) & 1));
        if ((unitsperline != 0) && ((long)puVar11 - (long)first != lVar8)) {
          output_padding(os,unitsperline - (int)((long)puVar11 - (long)first),filler);
        }
        if (uVar4 != 0x20) {
          std::operator<<(os,"  ");
          goto LAB_00106033;
        }
LAB_0010602a:
        if (unitsperline == 0) goto LAB_00106076;
      }
      else {
        if (uVar4 == 0x20) goto LAB_0010602a;
LAB_00106033:
        output_asc(os,curline.first,curline.second);
        if (unitsperline == 0) goto LAB_00106076;
        if ((long)puVar11 - (long)first != lVar8) {
          output_asc_padding(os,unitsperline - (int)((long)puVar11 - (long)first));
        }
      }
      std::operator<<(os,"\n");
    }
    else {
      bVar3 = data_is_equal<std::pair<unsigned_char_const*,unsigned_char_const*>>
                        (&local_48,&curline);
      if (!bVar3) {
        local_48.first = curline.first;
        local_48.second = curline.second;
        goto LAB_00105f5f;
      }
      iVar5 = count_identical_lines(first,this->_last,unitsperline);
      local_58 = (int)uVar7;
      if (iVar5 <= local_58) goto LAB_00105f5f;
      poVar9 = std::operator<<(os,"* [ 0x");
      *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
           *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
      std::operator<<(poVar9," lines ]\n");
      puVar11 = first + iVar5 * unitsperline;
    }
LAB_00106076:
    puVar10 = first + uVar6;
    first = puVar11;
    if (uVar6 != 0) {
      first = puVar10;
    }
  } while( true );
}

Assistant:

void dump(std::ostream& os) const
    {
        // make copy of current 'os' settings
        char filler = os.fill();  // what to output between hex numbers.
        int unitsperline = os.width();  // when not set: everything on one line
        // upl == 0 -> everything on one line
        // upl ==-1 -> unspecified -> use defaults
        //int unitwidth = os.precision(); // NOT USED (yet)
        int adjust = os.flags() & os.adjustfield;
        int numberbase = os.flags() & os.basefield;

        bool showbase = os.flags() & os.showbase;
        bool showpos = os.flags() & os.showpos;
        bool showoffset = os.flags() & os.showpoint;
        bool uppercasehex = os.flags() & os.uppercase;
        bool summarize = os.flags() & os.skipws;

        uint64_t ofs = showoffset ? getbaseofs(os) : 0;
        uint64_t step = getstep(os);

        int threshold = getthreshold(os);

        // showpos adjust
        //   yes     left    %+-b     ...    invalid
        //   yes     right   %+b     asc only
        //   no      left    %-b     hex only
        //   no      right   %b      hex + asc

        if (unitsperline==-1) {
            if (adjust == os.left)
                unitsperline = 32 / sizeof(T);
            else if (showpos)
                unitsperline = 64 / sizeof(T);
            else
                unitsperline = 16 / sizeof(T);
        }

        auto p = _first;

        //auto prevp = p;
        auto prevline = std::make_pair(p, p);

        os << std::right;
        os.width(0);
        while (p < _last) {
            auto pend = unitsperline ? std::min(_last, p+unitsperline) : _last;
            auto curline = std::make_pair(p, pend);
            if (summarize) {
                if (data_is_equal(prevline, curline)) {
                    int count = count_identical_lines(p, _last, unitsperline);
                    if (count > threshold) {
                        os << "* [ 0x" << std::hex << count << " lines ]\n";
                        pend = p + count * unitsperline;

                        goto next;
                    }
                }
                else {
                    prevline = curline;
                }
            }

            if (showoffset)
                os << std::setw(8) << std::setfill('0') << std::hex << ofs << ": ";
            if (!showpos) {
                output_hex(os, curline.first, curline.second, filler, numberbase, showbase, uppercasehex);
                if (unitsperline && pend-p != unitsperline)
                    output_padding(os, unitsperline-(pend-p), filler);
            }

            if (!showpos && adjust != os.left)
                os << "  ";   // separate left from right
            if (adjust != os.left)
            {
                output_asc(os, curline.first, curline.second);
                if (unitsperline && pend-p != unitsperline)
                    output_asc_padding(os, unitsperline-(pend-p));
            }

            if (unitsperline)
                os << "\n";

        next:
            if (step) {
                ofs += step;
                p += step;
            }
            else {
                ofs += sizeof(T) * (pend-p);
                p = pend;
            }
        }
        clearflags(os);
    }